

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O3

void __thiscall QGraphicsWidget::insertAction(QGraphicsWidget *this,QAction *before,QAction *action)

{
  ulong uVar1;
  QPodArrayOps<QAction*> *this_00;
  long *plVar2;
  long lVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  QAction *pQVar8;
  QPodArrayOps<QObject*> *this_01;
  long in_FS_OFFSET;
  QAction *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (action == (QAction *)0x0) {
    insertAction();
    goto LAB_0063cdb2;
  }
  lVar3 = *(long *)(this + 0x18);
  this_00 = (QPodArrayOps<QAction*> *)(lVar3 + 0x1f0);
  lVar5 = *(long *)(lVar3 + 0x200);
  if (lVar5 == 0) {
    bVar4 = true;
LAB_0063cd2e:
    lVar5 = 0;
    pQVar8 = (QAction *)0x0;
  }
  else {
    lVar6 = -0x100000000;
    uVar7 = 0xfffffffffffffff8;
    do {
      bVar4 = true;
      if (lVar5 * -8 + uVar7 == -8) goto LAB_0063ccd9;
      lVar6 = lVar6 + 0x100000000;
      uVar1 = uVar7 + 8;
      plVar2 = (long *)(*(long *)(lVar3 + 0x1f8) + 8 + uVar7);
      uVar7 = uVar1;
    } while ((QAction *)*plVar2 != action);
    if ((int)(~uVar1 >> 3) != 0) {
      QList<QAction_*>::removeAt((QList<QAction_*> *)this_00,lVar6 >> 0x20);
      lVar5 = *(long *)(lVar3 + 0x200);
      bVar4 = false;
    }
LAB_0063ccd9:
    if (lVar5 == 0) goto LAB_0063cd2e;
    uVar7 = 0xfffffffffffffff8;
    do {
      pQVar8 = (QAction *)0x0;
      if (lVar5 * -8 + uVar7 == -8) goto LAB_0063cd33;
      uVar1 = uVar7 + 8;
      plVar2 = (long *)(*(long *)(lVar3 + 0x1f8) + 8 + uVar7);
      uVar7 = uVar1;
    } while ((QAction *)*plVar2 != before);
    pQVar8 = (QAction *)0x0;
    if ((uVar1 >> 0x22 & 1) == 0) {
      lVar5 = (long)uVar1 >> 3;
      pQVar8 = before;
    }
  }
LAB_0063cd33:
  local_58 = action;
  QtPrivate::QPodArrayOps<QAction*>::emplace<QAction*&>(this_00,(long)(int)lVar5,&local_58);
  QList<QAction_*>::begin((QList<QAction_*> *)this_00);
  if (bVar4) {
    this_01 = (QPodArrayOps<QObject*> *)(*(long *)(action + 8) + 0x140);
    local_58 = (QAction *)this;
    QtPrivate::QPodArrayOps<QObject*>::emplace<QObject*&>
              (this_01,*(qsizetype *)(*(long *)(action + 8) + 0x150),(QObject **)&local_58);
    QList<QObject_*>::end((QList<QObject_*> *)this_01);
  }
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = (QAction *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QActionEvent::QActionEvent((QActionEvent *)&local_58,0x72,action,pQVar8);
  QCoreApplication::sendEvent((QObject *)this,(QEvent *)&local_58);
  QActionEvent::~QActionEvent((QActionEvent *)&local_58);
LAB_0063cdb2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsWidget::insertAction(QAction *before, QAction *action)
{
    if (!action) {
        qWarning("QWidget::insertAction: Attempt to insert null action");
        return;
    }

    Q_D(QGraphicsWidget);
    int index = d->actions.indexOf(action);
    if (index != -1)
        d->actions.removeAt(index);

    int pos = d->actions.indexOf(before);
    if (pos < 0) {
        before = nullptr;
        pos = d->actions.size();
    }
    d->actions.insert(pos, action);

    if (index == -1) {
        QActionPrivate *apriv = action->d_func();
        apriv->associatedObjects.append(this);
    }

    QActionEvent e(QEvent::ActionAdded, action, before);
    QCoreApplication::sendEvent(this, &e);
}